

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long local_30;
  void *pointer;
  uint local_20;
  int suites_failed;
  int suites_tested;
  int v;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_20 = 0;
  pointer._4_4_ = 0;
  _suites_tested = argv;
  argv_local._0_4_ = argc;
  memset(&local_30,0,8);
  if (local_30 != 0) {
    printf("all-bits-zero is not a NULL pointer\n");
    exit(1);
  }
  iVar1 = run_test_snprintf();
  if (iVar1 != 0) {
    printf("the snprintf implementation is broken\n");
    exit(1);
  }
  if (((int)argv_local == 2) &&
     ((iVar1 = strcmp(_suites_tested[1],"--quiet"), iVar1 == 0 ||
      (iVar1 = strcmp(_suites_tested[1],"-q"), iVar1 == 0)))) {
    suites_failed = 0;
  }
  else {
    suites_failed = 1;
    printf(anon_var_dwarf_106f7 + 8);
  }
  iVar1 = mbedtls_md5_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_ripemd160_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_sha1_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_sha256_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_sha512_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_arc4_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_des_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_aes_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_gcm_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_ccm_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_base64_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_mpi_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_rsa_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_x509_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_xtea_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_camellia_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_ctr_drbg_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_hmac_drbg_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_ecp_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_dhm_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_entropy_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_pkcs5_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  iVar1 = mbedtls_timing_self_test(suites_failed);
  if (iVar1 != 0) {
    pointer._4_4_ = pointer._4_4_ + 1;
  }
  local_20 = local_20 + 1;
  if (suites_failed != 0) {
    printf("  Executed %d test suites\n\n",(ulong)local_20);
    if ((int)pointer._4_4_ < 1) {
      printf("  [ All tests PASS ]\n\n");
    }
    else {
      printf("  [ %d tests FAIL ]\n\n",(ulong)pointer._4_4_);
    }
  }
  if (0 < (int)pointer._4_4_) {
    exit(1);
  }
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
    int v, suites_tested = 0, suites_failed = 0;
#if defined(MBEDTLS_MEMORY_BUFFER_ALLOC_C) && defined(MBEDTLS_SELF_TEST)
    unsigned char buf[1000000];
#endif
    void *pointer;

    /*
     * The C standard doesn't guarantee that all-bits-0 is the representation
     * of a NULL pointer. We do however use that in our code for initializing
     * structures, which should work on every modern platform. Let's be sure.
     */
    memset( &pointer, 0, sizeof( void * ) );
    if( pointer != NULL )
    {
        mbedtls_printf( "all-bits-zero is not a NULL pointer\n" );
        mbedtls_exit( MBEDTLS_EXIT_FAILURE );
    }

    /*
     * Make sure we have a snprintf that correctly zero-terminates
     */
    if( run_test_snprintf() != 0 )
    {
        mbedtls_printf( "the snprintf implementation is broken\n" );
        mbedtls_exit( MBEDTLS_EXIT_FAILURE );
    }

    if( argc == 2 && ( strcmp( argv[1], "--quiet" ) == 0  ||
        strcmp( argv[1], "-q" ) == 0 ) )
    {
        v = 0;
    }
    else
    {
        v = 1;
        mbedtls_printf( "\n" );
    }

#if defined(MBEDTLS_SELF_TEST)

#if defined(MBEDTLS_MEMORY_BUFFER_ALLOC_C)
    mbedtls_memory_buffer_alloc_init( buf, sizeof(buf) );
#endif

#if defined(MBEDTLS_MD2_C)
    if( mbedtls_md2_self_test( v )  != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_MD4_C)
    if( mbedtls_md4_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_MD5_C)
    if( mbedtls_md5_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_RIPEMD160_C)
    if( mbedtls_ripemd160_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_SHA1_C)
    if( mbedtls_sha1_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_SHA256_C)
    if( mbedtls_sha256_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_SHA512_C)
    if( mbedtls_sha512_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_ARC4_C)
    if( mbedtls_arc4_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_DES_C)
    if( mbedtls_des_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_AES_C)
    if( mbedtls_aes_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_GCM_C) && defined(MBEDTLS_AES_C)
    if( mbedtls_gcm_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_CCM_C) && defined(MBEDTLS_AES_C)
    if( mbedtls_ccm_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_CMAC_C)
    if( ( mbedtls_cmac_self_test( v ) ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_BASE64_C)
    if( mbedtls_base64_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_BIGNUM_C)
    if( mbedtls_mpi_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_rsa_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_X509_USE_C)
    if( mbedtls_x509_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_XTEA_C)
    if( mbedtls_xtea_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_CAMELLIA_C)
    if( mbedtls_camellia_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_CTR_DRBG_C)
    if( mbedtls_ctr_drbg_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_HMAC_DRBG_C)
    if( mbedtls_hmac_drbg_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_ECP_C)
    if( mbedtls_ecp_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_ECJPAKE_C)
    if( mbedtls_ecjpake_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_DHM_C)
    if( mbedtls_dhm_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_ENTROPY_C)

#if defined(MBEDTLS_ENTROPY_NV_SEED) && !defined(MBEDTLS_NO_PLATFORM_ENTROPY)
    create_entropy_seed_file();
#endif

    if( mbedtls_entropy_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_PKCS5_C)
    if( mbedtls_pkcs5_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

/* Slow tests last */

#if defined(MBEDTLS_TIMING_C)
    if( mbedtls_timing_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

    if( v != 0 )
    {
#if defined(MBEDTLS_MEMORY_BUFFER_ALLOC_C) && defined(MBEDTLS_MEMORY_DEBUG)
        mbedtls_memory_buffer_alloc_status();
#endif
    }

#if defined(MBEDTLS_MEMORY_BUFFER_ALLOC_C)
    mbedtls_memory_buffer_alloc_free();
    if( mbedtls_memory_buffer_alloc_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#else
    mbedtls_printf( " MBEDTLS_SELF_TEST not defined.\n" );
#endif

    if( v != 0 )
    {
        mbedtls_printf( "  Executed %d test suites\n\n", suites_tested );

        if( suites_failed > 0)
        {
            mbedtls_printf( "  [ %d tests FAIL ]\n\n", suites_failed );
        }
        else
        {
            mbedtls_printf( "  [ All tests PASS ]\n\n" );
        }
#if defined(_WIN32)
        mbedtls_printf( "  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif
    }

    if( suites_failed > 0)
        mbedtls_exit( MBEDTLS_EXIT_FAILURE );

    /* return() is here to prevent compiler warnings */
    return( MBEDTLS_EXIT_SUCCESS );
}